

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.c++
# Opt level: O3

Equality __thiscall capnp::AnyStruct::Reader::equals(Reader *this,Reader right)

{
  ushort uVar1;
  void *__s1;
  SegmentReader *pSVar2;
  CapTableReader *pCVar3;
  WirePointer *pWVar4;
  Reader right_00;
  int iVar5;
  PointerType PVar6;
  Equality EVar7;
  size_t __n;
  size_t sVar8;
  ulong uVar9;
  Equality EVar10;
  ulong uVar11;
  ulong uVar12;
  PointerReader local_90;
  SegmentReader *local_70;
  WirePointer *local_68;
  CapTableReader *local_60;
  SegmentReader *local_58;
  SegmentReader *local_50;
  CapTableReader *pCStack_48;
  long local_40;
  int iStack_38;
  undefined4 uStack_34;
  
  __s1 = (this->_reader).data;
  uVar12 = (ulong)((this->_reader).dataSize >> 3);
  do {
    __n = uVar12;
    if (__n == 0) break;
    uVar12 = __n - 1;
  } while (*(char *)((long)__s1 + (__n - 1)) == '\0');
  uVar12 = (ulong)(right._reader.dataSize >> 3);
  do {
    sVar8 = uVar12;
    if (sVar8 == 0) break;
    uVar12 = sVar8 - 1;
  } while (*(char *)((long)right._reader.data + (sVar8 - 1)) == '\0');
  EVar10 = NOT_EQUAL;
  if ((__n == sVar8) && (iVar5 = bcmp(__s1,right._reader.data,__n), EVar10 = NOT_EQUAL, iVar5 == 0))
  {
    pSVar2 = (this->_reader).segment;
    pCVar3 = (this->_reader).capTable;
    pWVar4 = (this->_reader).pointers;
    uVar1 = (this->_reader).pointerCount;
    uVar12 = (ulong)uVar1;
    iVar5 = (this->_reader).nestingLimit;
    local_68 = pWVar4;
    local_60 = pCVar3;
    local_58 = pSVar2;
    if (uVar12 != 0) {
      uVar9 = (ulong)uVar1 * 0x40 + 0x3fffffffc0;
      do {
        local_90.pointer =
             (WirePointer *)((long)&(pWVar4->offsetAndKind).value + (uVar9 >> 3 & 0x7fffffff8));
        local_90.segment = pSVar2;
        local_90.capTable = pCVar3;
        local_90.nestingLimit = iVar5;
        PVar6 = _::PointerReader::getPointerType(&local_90);
        if (PVar6 != NULL_) goto LAB_001f3a0a;
        uVar9 = uVar9 - 0x40;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
    uVar12 = 0;
LAB_001f3a0a:
    local_70 = right._reader.segment;
    uVar9 = (ulong)right._reader.pointerCount;
    if (uVar9 != 0) {
      uVar11 = (ulong)right._reader.pointerCount * 0x40 + 0x3fffffffc0;
      do {
        local_90.pointer =
             (WirePointer *)
             ((long)&((right._reader.pointers)->offsetAndKind).value + (uVar11 >> 3 & 0x7fffffff8));
        local_90.segment = local_70;
        local_90.capTable = right._reader.capTable;
        local_90.nestingLimit = right._reader.nestingLimit;
        PVar6 = _::PointerReader::getPointerType(&local_90);
        if (PVar6 != NULL_) goto LAB_001f3a8c;
        uVar11 = uVar11 - 0x40;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
    uVar9 = 0;
LAB_001f3a8c:
    EVar10 = NOT_EQUAL;
    if ((uVar12 == uVar9) && (EVar10 = EQUAL, uVar12 != 0)) {
      uVar9 = 0;
      do {
        local_90.pointer =
             (WirePointer *)((long)&(local_68->offsetAndKind).value + (uVar9 & 0x7fffffff8));
        local_90.segment = local_58;
        local_90.capTable = local_60;
        local_40 = (long)&((right._reader.pointers)->offsetAndKind).value + (uVar9 & 0x7fffffff8);
        local_50 = local_70;
        pCStack_48 = right._reader.capTable;
        iStack_38 = right._reader.nestingLimit;
        right_00.reader._28_4_ = uStack_34;
        right_00.reader.nestingLimit = right._reader.nestingLimit;
        right_00.reader.capTable = right._reader.capTable;
        right_00.reader.segment = local_70;
        right_00.reader.pointer = (WirePointer *)local_40;
        local_90.nestingLimit = iVar5;
        EVar7 = AnyPointer::Reader::equals((Reader *)&local_90,right_00);
        if ((EVar7 != EQUAL) && (EVar10 = EVar7, EVar7 != UNKNOWN_CONTAINS_CAPS)) {
          if (EVar7 == NOT_EQUAL) {
            return NOT_EQUAL;
          }
          kj::_::unreachable();
        }
        uVar9 = uVar9 + 8;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
  }
  return EVar10;
}

Assistant:

Equality AnyStruct::Reader::equals(AnyStruct::Reader right) const {
  auto dataL = getDataSection();
  size_t dataSizeL = dataL.size();
  while(dataSizeL > 0 && dataL[dataSizeL - 1] == 0) {
    -- dataSizeL;
  }

  auto dataR = right.getDataSection();
  size_t dataSizeR = dataR.size();
  while(dataSizeR > 0 && dataR[dataSizeR - 1] == 0) {
    -- dataSizeR;
  }

  if(dataSizeL != dataSizeR) {
    return Equality::NOT_EQUAL;
  }

  if(0 != memcmp(dataL.begin(), dataR.begin(), dataSizeL)) {
    return Equality::NOT_EQUAL;
  }

  auto ptrsL = getPointerSection();
  size_t ptrsSizeL = ptrsL.size();
  while (ptrsSizeL > 0 && ptrsL[ptrsSizeL - 1].isNull()) {
    -- ptrsSizeL;
  }

  auto ptrsR = right.getPointerSection();
  size_t ptrsSizeR = ptrsR.size();
  while (ptrsSizeR > 0 && ptrsR[ptrsSizeR - 1].isNull()) {
    -- ptrsSizeR;
  }

  if(ptrsSizeL != ptrsSizeR) {
    return Equality::NOT_EQUAL;
  }

  size_t i = 0;

  auto eqResult = Equality::EQUAL;
  for (; i < ptrsSizeL; i++) {
    auto l = ptrsL[i];
    auto r = ptrsR[i];
    switch(l.equals(r)) {
      case Equality::EQUAL:
        break;
      case Equality::NOT_EQUAL:
        return Equality::NOT_EQUAL;
      case Equality::UNKNOWN_CONTAINS_CAPS:
        eqResult = Equality::UNKNOWN_CONTAINS_CAPS;
        break;
      default:
        KJ_UNREACHABLE;
    }
  }

  return eqResult;
}